

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

UniquePtr<SSL_SESSION> __thiscall
bssl::anon_unknown_0::CreateClientSession
          (anon_unknown_0 *this,SSL_CTX *client_ctx,SSL_CTX *server_ctx,ClientConfig *config)

{
  bool bVar1;
  UniquePtr<SSL_SESSION> extraout_RAX;
  UniquePtr<SSL> server;
  UniquePtr<SSL> client;
  _Head_base<0UL,_ssl_st_*,_false> local_40;
  _Head_base<0UL,_ssl_st_*,_false> local_38;
  
  std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)
             &(anonymous_namespace)::g_last_session,(pointer)0x0);
  SSL_CTX_sess_set_new_cb((SSL_CTX *)client_ctx,SaveLastSession);
  local_38._M_head_impl = (SSL *)0x0;
  local_40._M_head_impl = (SSL *)0x0;
  bVar1 = ConnectClientAndServer
                    ((UniquePtr<SSL> *)&local_38,(UniquePtr<SSL> *)&local_40,client_ctx,server_ctx,
                     config,true);
  if (bVar1) {
    bVar1 = FlushNewSessionTickets(local_38._M_head_impl,local_40._M_head_impl);
    if (bVar1) {
      SSL_CTX_sess_set_new_cb((SSL_CTX *)client_ctx,(new_session_cb *)0x0);
      if ((anonymous_namespace)::g_last_session == 0) {
        _GLOBAL__N_1::CreateClientSession();
      }
      else {
        *(long *)this = (anonymous_namespace)::g_last_session;
        this = (anon_unknown_0 *)&(anonymous_namespace)::g_last_session;
      }
      goto LAB_0017d097;
    }
  }
  _GLOBAL__N_1::CreateClientSession();
LAB_0017d097:
  *(undefined8 *)this = 0;
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_40);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_38);
  return (UniquePtr<SSL_SESSION>)
         extraout_RAX._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
}

Assistant:

static bssl::UniquePtr<SSL_SESSION> CreateClientSession(
    SSL_CTX *client_ctx, SSL_CTX *server_ctx,
    const ClientConfig &config = ClientConfig()) {
  g_last_session = nullptr;
  SSL_CTX_sess_set_new_cb(client_ctx, SaveLastSession);

  // Connect client and server to get a session.
  bssl::UniquePtr<SSL> client, server;
  if (!ConnectClientAndServer(&client, &server, client_ctx, server_ctx,
                              config) ||
      !FlushNewSessionTickets(client.get(), server.get())) {
    fprintf(stderr, "Failed to connect client and server.\n");
    return nullptr;
  }

  SSL_CTX_sess_set_new_cb(client_ctx, nullptr);

  if (!g_last_session) {
    fprintf(stderr, "Client did not receive a session.\n");
    return nullptr;
  }
  return std::move(g_last_session);
}